

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O2

Vector<double,_3U> * __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::getStdDev
          (Vector<double,_3U> *__return_storage_ptr__,Accumulator<OpenMD::Vector<double,_3U>_> *this
          )

{
  size_t i;
  long lVar1;
  double dVar2;
  Vector<double,_3U> variance;
  Vector<double,_3U> local_28;
  
  Vector<double,_3U>::Vector(__return_storage_ptr__);
  getVariance(&local_28,this);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    dVar2 = local_28.data_[lVar1];
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    __return_storage_ptr__->data_[lVar1] = dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<RealType, Dim> getStdDev() const {
      assert(Count_ != 0);

      Vector<RealType, Dim> sd {};
      Vector<RealType, Dim> variance = this->getVariance();

      for (std::size_t i = 0; i < Dim; i++) {
        sd[i] = std::sqrt(variance[i]);
      }

      return sd;
    }